

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetExternalData(JsValueRef object,void **data)

{
  bool bVar1;
  Data DVar2;
  undefined8 in_RAX;
  JavascriptProxy *this;
  JsrtExternalObject *this_00;
  void *pvVar3;
  CustomExternalWrapperObject *this_01;
  JsErrorCode JVar4;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  
  JVar4 = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    if (data == (void **)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
      local_28.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
      local_28.hasException = true;
      DVar2 = ExceptionCheck::Save();
      local_28.__exceptionCheck.handledExceptionType = DVar2.handledExceptionType;
      while (bVar1 = Js::VarIs<Js::JavascriptProxy>(object), bVar1) {
        this = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
        object = Js::JavascriptProxy::GetTarget(this);
      }
      bVar1 = Js::VarIs<JsrtExternalObject>(object);
      if (bVar1) {
        this_00 = Js::UnsafeVarTo<JsrtExternalObject>(object);
        pvVar3 = JsrtExternalObject::GetSlotData(this_00);
      }
      else {
        bVar1 = Js::VarIs<Js::CustomExternalWrapperObject>(object);
        if (!bVar1) {
          *data = (void *)0x0;
          local_28.hasException = false;
          DebugCheckNoException::~DebugCheckNoException(&local_28);
          return JsErrorInvalidArgument;
        }
        this_01 = Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object);
        pvVar3 = Js::CustomExternalWrapperObject::GetSlotData(this_01);
      }
      *data = pvVar3;
      local_28.hasException = false;
      DebugCheckNoException::~DebugCheckNoException(&local_28);
      JVar4 = JsNoError;
    }
  }
  return JVar4;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetExternalData(_In_ JsValueRef object, _Out_ void **data)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(data);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object)->GetTarget();
        }
        if (Js::VarIs<JsrtExternalObject>(object))
        {
            *data = Js::UnsafeVarTo<JsrtExternalObject>(object)->GetSlotData();
        }
#ifdef _CHAKRACOREBUILD
        else if (Js::VarIs<Js::CustomExternalWrapperObject>(object))
        {
            *data = Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object)->GetSlotData();
        }
#endif
        else
        {
            *data = nullptr;
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }
    }
    END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetExternalData(_In_ JsValueRef object, _In_opt_ void *data)
{
    VALIDATE_JSREF(object);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object)->GetTarget();
        }
        if (Js::VarIs<JsrtExternalObject>(object))
        {
            Js::UnsafeVarTo<JsrtExternalObject>(object)->SetSlotData(data);
        }
#ifdef _CHAKRACOREBUILD
        else if (Js::VarIs<Js::CustomExternalWrapperObject>(object))
        {
            Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object)->SetSlotData(data);
        }
#endif
        else
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }
    }
    END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsCallFunction(_In_ JsValueRef function, _In_reads_(cargs) JsValueRef *args, _In_ ushort cargs, _Out_opt_ JsValueRef *result)
{
    if(result != nullptr)
    {
        *result = nullptr;
    }